

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O0

EigenAnswer * PowerIterationMethod(EigenAnswer *__return_storage_ptr__,Matrix *m,int *iter)

{
  initializer_list<EigenAnswer> c;
  initializer_list<EigenAnswer> c_00;
  bool bVar1;
  size_type __n;
  reference pvVar2;
  EigenAnswer *local_210;
  EigenAnswer *local_1c0;
  Vector local_188;
  Vector local_170;
  EigenAnswer *local_158;
  EigenAnswer local_150;
  EigenAnswer local_130;
  EigenAnswer local_110;
  undefined1 local_f0 [24];
  EigenAnswer real;
  Vector third;
  Vector second;
  Vector first;
  EigenAnswer bad;
  allocator<double> local_41;
  undefined1 local_40 [8];
  Vector initial;
  int n;
  int *iter_local;
  Matrix *m_local;
  EigenAnswer *opposite;
  
  initial.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = Matrix::GetRows(m);
  __n = (size_type)
        initial.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
  std::allocator<double>::allocator(&local_41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_40,__n,&local_41);
  std::allocator<double>::~allocator(&local_41);
  pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_40,0);
  *pvVar2 = 1.0;
  EigenAnswer::EigenAnswer
            ((EigenAnswer *)
             &first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  *iter = 0;
  while (*iter < 30000) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)
               &second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,
               (vector<double,_std::allocator<double>_> *)local_40);
    Matrix::operator*((Vector *)
                      &third.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,m,
                      (Vector *)
                      &second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    Matrix::operator*((Vector *)&real.value,m,
                      (Vector *)
                      &third.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
    RealValues((EigenAnswer *)(local_f0 + 0x10),
               (Vector *)
               &third.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(Vector *)&real.value);
    local_130.value = (double)&local_110;
    EigenAnswer::EigenAnswer((EigenAnswer *)local_130.value,(EigenAnswer *)(local_f0 + 0x10));
    local_f0._0_8_ = &local_110;
    local_f0._8_8_ = (pointer)0x1;
    c_00._M_len = 1;
    c_00._M_array = (iterator)local_f0._0_8_;
    bVar1 = TestEigen(m,c_00,1e-13);
    local_1c0 = (EigenAnswer *)local_f0;
    do {
      local_1c0 = local_1c0 + -1;
      EigenAnswer::~EigenAnswer(local_1c0);
    } while (local_1c0 != &local_110);
    if (bVar1) {
      EigenAnswer::EigenAnswer(__return_storage_ptr__,(EigenAnswer *)(local_f0 + 0x10));
      local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    else {
      local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._3_1_ = 0;
      OppositeRealValues(__return_storage_ptr__,
                         (Vector *)
                         &second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,
                         (Vector *)
                         &third.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(Vector *)&real.value);
      local_158 = &local_150;
      EigenAnswer::EigenAnswer(local_158,__return_storage_ptr__);
      local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)&local_150;
      local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x1;
      c._M_len = 1;
      c._M_array = (iterator)
                   local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      bVar1 = TestEigen(m,c,1e-13);
      local_210 = &local_130;
      do {
        local_210 = local_210 + -1;
        EigenAnswer::~EigenAnswer(local_210);
      } while (local_210 != &local_150);
      if (bVar1) {
        local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._3_1_ = 1;
      }
      else {
        EigenAnswer::operator=
                  ((EigenAnswer *)
                   &first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,__return_storage_ptr__);
        Matrix::operator*(&local_188,m,(Vector *)&real.value);
        Utils::Normalized(&local_170,&local_188);
        std::vector<double,_std::allocator<double>_>::operator=
                  ((vector<double,_std::allocator<double>_> *)local_40,&local_170);
        std::vector<double,_std::allocator<double>_>::~vector(&local_170);
        std::vector<double,_std::allocator<double>_>::~vector(&local_188);
        *iter = *iter + 1;
      }
      local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (uint)bVar1;
      if ((local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 0) {
        EigenAnswer::~EigenAnswer(__return_storage_ptr__);
      }
    }
    EigenAnswer::~EigenAnswer((EigenAnswer *)(local_f0 + 0x10));
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)&real.value);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &third.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    if (local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_0010f0b6;
    *iter = *iter + 3;
  }
  EigenAnswer::EigenAnswer
            (__return_storage_ptr__,
             (EigenAnswer *)
             &first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_130.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_0010f0b6:
  EigenAnswer::~EigenAnswer
            ((EigenAnswer *)
             &first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_40);
  return __return_storage_ptr__;
}

Assistant:

EigenAnswer PowerIterationMethod(const Matrix &m, int &iter)
{
    const int n = m.GetRows();
    Vector initial(n);
    initial[0] = 1;

    EigenAnswer bad;
    for (iter = 0; iter < defaultMaxIterations; iter += 3)
    {
        auto first = initial;
        auto second = m * first;
        auto third = m * second;

        auto real = RealValues(second, third);
        if (TestEigen(m, {real}, PIeps))
        {
            return real;
        }

        auto opposite = OppositeRealValues(first, second, third);
        if (TestEigen(m, {opposite}, PIeps))
        {
            return opposite;
        }
        bad = opposite;
        initial = Utils::Normalized(m * third);
        iter++;
    }

    return bad;
}